

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O0

void SHRotateXPlus(rot_data_t *c_in,rot_data_t *c_out,int lmax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int lmax_local;
  rot_data_t *c_out_local;
  rot_data_t *c_in_local;
  
  *c_out = *c_in;
  if (0 < lmax) {
    iVar5 = SHIndex(1,0);
    c_out[1] = c_in[iVar5];
    iVar5 = SHIndex(1,-1);
    c_out[2] = c_in[iVar5] * -1.0;
    iVar5 = SHIndex(1,1);
    c_out[3] = c_in[iVar5];
    if (1 < lmax) {
      iVar5 = SHIndex(2,1);
      c_out[4] = c_in[iVar5];
      iVar5 = SHIndex(2,-1);
      c_out[5] = c_in[iVar5] * -1.0;
      iVar5 = SHIndex(2,0);
      fVar1 = c_in[iVar5];
      iVar5 = SHIndex(2,2);
      c_out[6] = fVar1 * -0.5 + -(c_in[iVar5] * 0.8660254);
      iVar5 = SHIndex(2,-2);
      c_out[7] = c_in[iVar5] * -1.0;
      iVar5 = SHIndex(2,0);
      fVar1 = c_in[iVar5];
      iVar5 = SHIndex(2,2);
      c_out[8] = fVar1 * -0.8660254 + c_in[iVar5] * 0.5;
      if (2 < lmax) {
        iVar5 = SHIndex(3,0);
        fVar1 = c_in[iVar5];
        iVar5 = SHIndex(3,2);
        c_out[9] = fVar1 * -0.7905694 + c_in[iVar5] * 0.61237246;
        iVar5 = SHIndex(3,-2);
        c_out[10] = c_in[iVar5] * -1.0;
        iVar5 = SHIndex(3,0);
        fVar1 = c_in[iVar5];
        iVar5 = SHIndex(3,2);
        c_out[0xb] = fVar1 * -0.61237246 + -(c_in[iVar5] * 0.7905694);
        iVar5 = SHIndex(3,-3);
        fVar1 = c_in[iVar5];
        iVar5 = SHIndex(3,-1);
        c_out[0xc] = fVar1 * 0.7905694 + c_in[iVar5] * 0.61237246;
        iVar5 = SHIndex(3,1);
        fVar1 = c_in[iVar5];
        iVar5 = SHIndex(3,3);
        c_out[0xd] = fVar1 * -0.25 + -(c_in[iVar5] * 0.96824586);
        iVar5 = SHIndex(3,-3);
        fVar1 = c_in[iVar5];
        iVar5 = SHIndex(3,-1);
        c_out[0xe] = fVar1 * -0.61237246 + c_in[iVar5] * 0.7905694;
        iVar5 = SHIndex(3,1);
        fVar1 = c_in[iVar5];
        iVar5 = SHIndex(3,3);
        c_out[0xf] = fVar1 * -0.96824586 + c_in[iVar5] * 0.25;
        if (3 < lmax) {
          iVar5 = SHIndex(4,1);
          fVar1 = c_in[iVar5];
          iVar5 = SHIndex(4,3);
          c_out[0x10] = fVar1 * -0.9354144 + c_in[iVar5] * 0.35355338;
          iVar5 = SHIndex(4,-3);
          fVar1 = c_in[iVar5];
          iVar5 = SHIndex(4,-1);
          c_out[0x11] = fVar1 * -0.75 + c_in[iVar5] * 0.6614378;
          iVar5 = SHIndex(4,1);
          fVar1 = c_in[iVar5];
          iVar5 = SHIndex(4,3);
          c_out[0x12] = fVar1 * -0.35355338 + -(c_in[iVar5] * 0.9354144);
          iVar5 = SHIndex(4,-3);
          fVar1 = c_in[iVar5];
          iVar5 = SHIndex(4,-1);
          c_out[0x13] = fVar1 * 0.6614378 + c_in[iVar5] * 0.75;
          iVar5 = SHIndex(4,0);
          fVar1 = c_in[iVar5];
          iVar5 = SHIndex(4,2);
          fVar2 = c_in[iVar5];
          iVar5 = SHIndex(4,4);
          c_out[0x14] = c_in[iVar5] * 0.73951 + fVar1 * 0.375 + fVar2 * 0.559017;
          iVar5 = SHIndex(4,-4);
          fVar1 = c_in[iVar5];
          iVar5 = SHIndex(4,-2);
          c_out[0x15] = fVar1 * 0.9354144 + c_in[iVar5] * 0.35355338;
          iVar5 = SHIndex(4,0);
          fVar1 = c_in[iVar5];
          iVar5 = SHIndex(4,2);
          fVar2 = c_in[iVar5];
          iVar5 = SHIndex(4,4);
          c_out[0x16] = c_in[iVar5] * -0.6614378 + fVar1 * 0.559017 + fVar2 * 0.5;
          iVar5 = SHIndex(4,-4);
          fVar1 = c_in[iVar5];
          iVar5 = SHIndex(4,-2);
          c_out[0x17] = fVar1 * -0.35355338 + c_in[iVar5] * 0.9354144;
          iVar5 = SHIndex(4,0);
          fVar1 = c_in[iVar5];
          iVar5 = SHIndex(4,2);
          fVar2 = c_in[iVar5];
          iVar5 = SHIndex(4,4);
          c_out[0x18] = c_in[iVar5] * 0.125 + fVar1 * 0.73951 + -(fVar2 * 0.6614378);
          if (4 < lmax) {
            iVar5 = SHIndex(5,0);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,2);
            fVar2 = c_in[iVar5];
            iVar5 = SHIndex(5,4);
            c_out[0x19] = c_in[iVar5] * 0.19764236 + fVar1 * 0.70156074 + -(fVar2 * 0.6846532);
            iVar5 = SHIndex(5,-4);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,-2);
            c_out[0x1a] = fVar1 * -0.5 + c_in[iVar5] * 0.8660254;
            iVar5 = SHIndex(5,0);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,2);
            fVar2 = c_in[iVar5];
            iVar5 = SHIndex(5,4);
            c_out[0x1b] = c_in[iVar5] * -0.79549515 + fVar1 * 0.5229125 + fVar2 * 0.30618623;
            iVar5 = SHIndex(5,-4);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,-2);
            c_out[0x1c] = fVar1 * 0.8660254 + c_in[iVar5] * 0.5;
            iVar5 = SHIndex(5,0);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,2);
            fVar2 = c_in[iVar5];
            iVar5 = SHIndex(5,4);
            c_out[0x1d] = c_in[iVar5] * 0.572822 + fVar1 * 0.48412293 + fVar2 * 0.6614378;
            iVar5 = SHIndex(5,-5);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,-3);
            fVar2 = c_in[iVar5];
            iVar5 = SHIndex(5,-1);
            c_out[0x1e] = c_in[iVar5] * -0.48412293 + fVar1 * -0.70156074 + -(fVar2 * 0.5229125);
            iVar5 = SHIndex(5,1);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,3);
            fVar2 = c_in[iVar5];
            iVar5 = SHIndex(5,5);
            c_out[0x1f] = c_in[iVar5] * 0.90571105 + fVar1 * 0.125 + fVar2 * 0.40504628;
            iVar5 = SHIndex(5,-5);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,-3);
            fVar2 = c_in[iVar5];
            iVar5 = SHIndex(5,-1);
            c_out[0x20] = c_in[iVar5] * -0.6614378 + fVar1 * 0.6846532 + -(fVar2 * 0.30618623);
            iVar5 = SHIndex(5,1);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,3);
            fVar2 = c_in[iVar5];
            iVar5 = SHIndex(5,5);
            c_out[0x21] = c_in[iVar5] * -0.41926274 + fVar1 * 0.40504628 + fVar2 * 0.8125;
            iVar5 = SHIndex(5,-5);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,-3);
            fVar2 = c_in[iVar5];
            iVar5 = SHIndex(5,-1);
            c_out[0x22] = c_in[iVar5] * -0.572822 + fVar1 * -0.19764236 + fVar2 * 0.79549515;
            iVar5 = SHIndex(5,1);
            fVar1 = c_in[iVar5];
            iVar5 = SHIndex(5,3);
            fVar2 = c_in[iVar5];
            iVar5 = SHIndex(5,5);
            c_out[0x23] = c_in[iVar5] * 0.0625 + fVar1 * 0.90571105 + -(fVar2 * 0.41926274);
            if (5 < lmax) {
              iVar5 = SHIndex(6,1);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,3);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,5);
              c_out[0x24] = c_in[iVar5] * 0.10825317 + fVar1 * 0.87945294 + -(fVar2 * 0.4635124);
              iVar5 = SHIndex(6,-5);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,-3);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,-1);
              c_out[0x25] = c_in[iVar5] * -0.5077524 + fVar1 * -0.3125 + fVar2 * 0.80282706;
              iVar5 = SHIndex(6,1);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,3);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,5);
              c_out[0x26] = c_in[iVar5] * -0.586302 + fVar1 * 0.4330127 + fVar2 * 0.6846532;
              iVar5 = SHIndex(6,-5);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,-3);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,-1);
              c_out[0x27] = c_in[iVar5] * -0.59292704 + fVar1 * 0.80282706 + -(fVar2 * 0.0625);
              iVar5 = SHIndex(6,1);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,3);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,5);
              c_out[0x28] = c_in[iVar5] * 0.80282706 + fVar1 * 0.19764236 + fVar2 * 0.5625;
              iVar5 = SHIndex(6,-5);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,-3);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,-1);
              c_out[0x29] = c_in[iVar5] * -0.625 + fVar1 * -0.5077524 + -(fVar2 * 0.59292704);
              iVar5 = SHIndex(6,0);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,2);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,4);
              fVar3 = c_in[iVar5];
              iVar5 = SHIndex(6,6);
              c_out[0x2a] = c_in[iVar5] * -0.67169327 +
                            fVar3 * -0.49607837 + fVar1 * -0.3125 + -(fVar2 * 0.45285553);
              iVar5 = SHIndex(6,-6);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,-4);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,-2);
              c_out[0x2b] = c_in[iVar5] * -0.19764236 + fVar1 * -0.87945294 + -(fVar2 * 0.4330127);
              iVar5 = SHIndex(6,0);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,2);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,4);
              fVar3 = c_in[iVar5];
              iVar5 = SHIndex(6,6);
              c_out[0x2c] = c_in[iVar5] * 0.69526863 +
                            fVar3 * -0.1711633 + fVar1 * -0.45285553 + -(fVar2 * 0.53125);
              iVar5 = SHIndex(6,-6);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,-4);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,-2);
              c_out[0x2d] = c_in[iVar5] * -0.5625 + fVar1 * 0.4635124 + -(fVar2 * 0.6846532);
              iVar5 = SHIndex(6,0);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,2);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,4);
              fVar3 = c_in[iVar5];
              iVar5 = SHIndex(6,6);
              c_out[0x2e] = c_in[iVar5] * -0.2538762 +
                            fVar3 * 0.8125 + fVar1 * -0.49607837 + -(fVar2 * 0.1711633);
              iVar5 = SHIndex(6,-6);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,-4);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,-2);
              c_out[0x2f] = c_in[iVar5] * -0.80282706 + fVar1 * -0.10825317 + fVar2 * 0.586302;
              iVar5 = SHIndex(6,0);
              fVar1 = c_in[iVar5];
              iVar5 = SHIndex(6,2);
              fVar2 = c_in[iVar5];
              iVar5 = SHIndex(6,4);
              fVar3 = c_in[iVar5];
              iVar5 = SHIndex(6,6);
              c_out[0x30] = c_in[iVar5] * 0.03125 +
                            fVar3 * -0.2538762 + fVar1 * -0.67169327 + fVar2 * 0.69526863;
              if (6 < lmax) {
                iVar5 = SHIndex(7,0);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,2);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,4);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,6);
                c_out[0x31] = c_in[iVar5] * 0.0584634 +
                              fVar3 * -0.298106 + fVar1 * -0.64725983 + fVar2 * 0.6991205;
                iVar5 = SHIndex(7,-6);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,-4);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,-2);
                c_out[0x32] = c_in[iVar5] * -0.7473913 + fVar1 * -0.1875 + fVar2 * 0.63737744;
                iVar5 = SHIndex(7,0);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,2);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,4);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,6);
                c_out[0x33] = c_in[iVar5] * -0.3983609 +
                              fVar3 * 0.78125 + fVar1 * -0.47495887 + -(fVar2 * 0.07328775);
                iVar5 = SHIndex(7,-6);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,-4);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,-2);
                c_out[0x34] = c_in[iVar5] * -0.586302 + fVar1 * 0.63737744 + -(fVar2 * 0.5);
                iVar5 = SHIndex(7,0);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,2);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,4);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,6);
                c_out[0x35] = c_in[iVar5] * 0.7927282 +
                              fVar3 * 0.10364453 + fVar1 * -0.42961648 + -(fVar2 * 0.41984466);
                iVar5 = SHIndex(7,-6);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,-4);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,-2);
                c_out[0x36] = c_in[iVar5] * -0.3125 + fVar1 * -0.7473913 + -(fVar2 * 0.586302);
                iVar5 = SHIndex(7,0);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,2);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,4);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,6);
                c_out[0x37] = c_in[iVar5] * -0.45768183 +
                              fVar3 * -0.53855276 + fVar1 * -0.41339865 + -(fVar2 * 0.5740992);
                iVar5 = SHIndex(7,-7);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,-5);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,-3);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,-1);
                c_out[0x38] = c_in[iVar5] * 0.41339865 +
                              fVar3 * 0.42961648 + fVar1 * 0.64725983 + fVar2 * 0.47495887;
                iVar5 = SHIndex(7,1);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,3);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,5);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,7);
                c_out[0x39] = c_in[iVar5] * -0.8562443 +
                              fVar3 * -0.44879395 + fVar1 * -0.078125 + -(fVar2 * 0.24356964);
                iVar5 = SHIndex(7,-7);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,-5);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,-3);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,-1);
                c_out[0x3a] = c_in[iVar5] * 0.5740992 +
                              fVar3 * 0.41984466 + fVar1 * -0.6991205 + fVar2 * 0.07328775;
                iVar5 = SHIndex(7,1);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,3);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,5);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,7);
                c_out[0x3b] = c_in[iVar5] * 0.49435288 +
                              fVar3 * -0.5700449 + fVar1 * -0.24356964 + -(fVar2 * 0.609375);
                iVar5 = SHIndex(7,-7);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,-5);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,-3);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,-1);
                c_out[0x3c] = c_in[iVar5] * 0.53855276 +
                              fVar3 * -0.10364453 + fVar1 * 0.298106 + -(fVar2 * 0.78125);
                iVar5 = SHIndex(7,1);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,3);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,5);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,7);
                c_out[0x3d] = c_in[iVar5] * -0.149053 +
                              fVar3 * 0.671875 + fVar1 * -0.44879395 + -(fVar2 * 0.5700449);
                iVar5 = SHIndex(7,-7);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,-5);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,-3);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,-1);
                c_out[0x3e] = c_in[iVar5] * 0.45768183 +
                              fVar3 * -0.7927282 + fVar1 * -0.0584634 + fVar2 * 0.3983609;
                iVar5 = SHIndex(7,1);
                fVar1 = c_in[iVar5];
                iVar5 = SHIndex(7,3);
                fVar2 = c_in[iVar5];
                iVar5 = SHIndex(7,5);
                fVar3 = c_in[iVar5];
                iVar5 = SHIndex(7,7);
                c_out[0x3f] = c_in[iVar5] * 0.015625 +
                              fVar3 * -0.149053 + fVar1 * -0.8562443 + fVar2 * 0.49435288;
                if (7 < lmax) {
                  iVar5 = SHIndex(8,1);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,3);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,5);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,7);
                  c_out[0x40] = c_in[iVar5] * 0.03125 +
                                fVar3 * -0.1848775 + fVar1 * -0.8356089 + fVar2 * 0.5163347;
                  iVar5 = SHIndex(8,-7);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,-5);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,-3);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,-1);
                  c_out[0x41] = c_in[iVar5] * 0.41780445 +
                                fVar3 * -0.7745021 + fVar1 * -0.109375 + fVar2 * 0.46219373;
                  iVar5 = SHIndex(8,1);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,3);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,5);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,7);
                  c_out[0x42] = c_in[iVar5] * -0.25674495 +
                                fVar3 * 0.708831 + fVar1 * -0.45768183 + -(fVar2 * 0.47134697);
                  iVar5 = SHIndex(8,-7);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,-5);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,-3);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,-1);
                  c_out[0x43] = c_in[iVar5] * 0.49435288 +
                                fVar3 * -0.21819125 + fVar1 * 0.46219373 + -(fVar2 * 0.703125);
                  iVar5 = SHIndex(8,1);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,3);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,5);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,7);
                  c_out[0x44] = c_in[iVar5] * 0.66658527 +
                                fVar3 * -0.33802044 + fVar1 * -0.27421764 + -(fVar2 * 0.6051536);
                  iVar5 = SHIndex(8,-7);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,-5);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,-3);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,-1);
                  c_out[0x45] = c_in[iVar5] * 0.53102016 +
                                fVar3 * 0.265625 + fVar1 * -0.7745021 + -(fVar2 * 0.21819125);
                  iVar5 = SHIndex(8,1);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,3);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,5);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,7);
                  c_out[0x46] = c_in[iVar5] * -0.6991205 +
                                fVar3 * -0.5908647 + fVar1 * -0.13072813 + -(fVar2 * 0.3808143);
                  iVar5 = SHIndex(8,-7);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,-5);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,-3);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,-1);
                  c_out[0x47] = c_in[iVar5] * 0.546875 +
                                fVar3 * 0.53102016 + fVar1 * 0.41780445 + fVar2 * 0.49435288;
                  iVar5 = SHIndex(8,0);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,2);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,4);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,6);
                  fVar4 = c_in[iVar5];
                  iVar5 = SHIndex(8,8);
                  c_out[0x48] = c_in[iVar5] * 0.62670666 +
                                fVar4 * 0.45768183 +
                                fVar3 * 0.41132647 + fVar1 * 0.2734375 + fVar2 * 0.39218438;
                  iVar5 = SHIndex(8,-8);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,-6);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,-4);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,-2);
                  c_out[0x49] = c_in[iVar5] * 0.13072813 +
                                fVar3 * 0.27421764 + fVar1 * 0.8356089 + fVar2 * 0.45768183;
                  iVar5 = SHIndex(8,0);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,2);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,4);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,8);
                  c_out[0x4a] = c_in[iVar5] * -0.6991205 +
                                fVar3 * 0.32775277 + fVar1 * 0.39218438 + fVar2 * 0.5;
                  iVar5 = SHIndex(8,-8);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,-6);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,-4);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,-2);
                  c_out[0x4b] = c_in[iVar5] * 0.3808143 +
                                fVar3 * 0.6051536 + fVar1 * -0.5163347 + fVar2 * 0.47134697;
                  iVar5 = SHIndex(8,0);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,2);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,4);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,6);
                  fVar4 = c_in[iVar5];
                  iVar5 = SHIndex(8,8);
                  c_out[0x4c] = c_in[iVar5] * 0.33329263 +
                                fVar4 * -0.73020756 +
                                fVar3 * -0.28125 + fVar1 * 0.41132647 + fVar2 * 0.32775277;
                  iVar5 = SHIndex(8,-8);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,-6);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,-4);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,-2);
                  c_out[0x4d] = c_in[iVar5] * 0.5908647 +
                                fVar3 * 0.33802044 + fVar1 * 0.1848775 + -(fVar2 * 0.708831);
                  iVar5 = SHIndex(8,0);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,4);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,6);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,8);
                  c_out[0x4e] = c_in[iVar5] * -0.08558165 +
                                fVar3 * 0.5 + fVar1 * 0.45768183 + -(fVar2 * 0.73020756);
                  iVar5 = SHIndex(8,-8);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,-6);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,-4);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,-2);
                  c_out[0x4f] = c_in[iVar5] * 0.6991205 +
                                fVar3 * -0.66658527 + fVar1 * -0.03125 + fVar2 * 0.25674495;
                  iVar5 = SHIndex(8,0);
                  fVar1 = c_in[iVar5];
                  iVar5 = SHIndex(8,2);
                  fVar2 = c_in[iVar5];
                  iVar5 = SHIndex(8,4);
                  fVar3 = c_in[iVar5];
                  iVar5 = SHIndex(8,6);
                  fVar4 = c_in[iVar5];
                  iVar5 = SHIndex(8,8);
                  c_out[0x50] = c_in[iVar5] * 0.0078125 +
                                fVar4 * -0.08558165 +
                                fVar3 * 0.33329263 + fVar1 * 0.62670666 + -(fVar2 * 0.6991205);
                  if (8 < lmax) {
                    iVar5 = SHIndex(9,0);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,2);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,4);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,6);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,8);
                    c_out[0x51] = c_in[iVar5] * 0.016572814 +
                                  fVar4 * -0.11158482 +
                                  fVar3 * 0.36157614 + fVar1 * 0.6090494 + -(fVar2 * 0.69684696);
                    iVar5 = SHIndex(9,-8);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,-6);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,-4);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,-2);
                    c_out[0x52] = c_in[iVar5] * 0.6569936 +
                                  fVar3 * -0.6817945 + fVar1 * -0.0625 + fVar2 * 0.3156095;
                    iVar5 = SHIndex(9,0);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,2);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,4);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,6);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,8);
                    c_out[0x53] = c_in[iVar5] * -0.15944009 +
                                  fVar4 * 0.56832916 +
                                  fVar3 * -0.67232907 + fVar1 * 0.44314852 + -(fVar2 * 0.05633674);
                    iVar5 = SHIndex(9,-8);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,-6);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,-4);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,-2);
                    c_out[0x54] = c_in[iVar5] * 0.5854686 +
                                  fVar3 * 0.20252314 + fVar1 * 0.3156095 + -(fVar2 * 0.71875);
                    iVar5 = SHIndex(9,0);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,2);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,4);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,6);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,8);
                    c_out[0x55] = c_in[iVar5] * 0.5093127 +
                                  fVar4 * -0.6051536 +
                                  fVar3 * -0.39218438 + fVar1 * 0.3963641 + fVar2 * 0.25194556;
                    iVar5 = SHIndex(9,-8);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,-6);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,-4);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,-2);
                    c_out[0x56] = c_in[iVar5] * 0.42158556 +
                                  fVar3 * 0.5625 + fVar1 * -0.6817945 + fVar2 * 0.20252314;
                    iVar5 = SHIndex(9,0);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,2);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,4);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,6);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,8);
                    c_out[0x57] = c_in[iVar5] * -0.7526808 +
                                  fVar4 * -0.298106 +
                                  fVar3 * 0.13799626 + fVar1 * 0.37548795 + fVar2 * 0.42961648;
                    iVar5 = SHIndex(9,-8);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,-6);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,-4);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,-2);
                    c_out[0x58] = c_in[iVar5] * 0.21875 +
                                  fVar3 * 0.42158556 + fVar1 * 0.6569936 + fVar2 * 0.5854686;
                    iVar5 = SHIndex(9,0);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,2);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,4);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,6);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,8);
                    c_out[0x59] = c_in[iVar5] * 0.38519666 +
                                  fVar4 * 0.45768183 +
                                  fVar3 * 0.49435288 + fVar1 * 0.3668549 + fVar2 * 0.5130142;
                    iVar5 = SHIndex(9,-9);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,-7);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,-5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,-3);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,-1);
                    c_out[0x5a] = c_in[iVar5] * -0.3668549 +
                                  fVar4 * -0.37548795 +
                                  fVar3 * -0.3963641 + fVar1 * -0.6090494 + -(fVar2 * 0.44314852);
                    iVar5 = SHIndex(9,1);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,3);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,7);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,9);
                    c_out[0x5b] = c_in[iVar5] * 0.8171255 +
                                  fVar4 * 0.46242478 +
                                  fVar3 * 0.29543236 + fVar1 * 0.0546875 + fVar2 * 0.16792332;
                    iVar5 = SHIndex(9,-9);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,-7);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,-5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,-3);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,-1);
                    c_out[0x5c] = c_in[iVar5] * -0.5130142 +
                                  fVar4 * -0.42961648 +
                                  fVar3 * -0.25194556 + fVar1 * 0.69684696 + fVar2 * 0.05633674;
                    iVar5 = SHIndex(9,1);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,3);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,7);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,9);
                    c_out[0x5d] = c_in[iVar5] * -0.53222567 +
                                  fVar4 * 0.38725105 +
                                  fVar3 * 0.5772798 + fVar1 * 0.16792332 + fVar2 * 0.453125;
                    iVar5 = SHIndex(9,-9);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,-7);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,-5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,-3);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,-1);
                    c_out[0x5e] = c_in[iVar5] * -0.49435288 +
                                  fVar4 * -0.13799626 +
                                  fVar3 * 0.39218438 + fVar1 * -0.36157614 + fVar2 * 0.67232907;
                    iVar5 = SHIndex(9,1);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,3);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,7);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,9);
                    c_out[0x5f] = c_in[iVar5] * 0.21608308 +
                                  fVar4 * -0.7162405 +
                                  fVar3 * 0.140625 + fVar1 * 0.29543236 + fVar2 * 0.5772798;
                    iVar5 = SHIndex(9,-9);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,-7);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,-5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,-3);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,-1);
                    c_out[0x60] = c_in[iVar5] * -0.45768183 +
                                  fVar4 * 0.298106 +
                                  fVar3 * 0.6051536 + fVar1 * 0.11158482 + -(fVar2 * 0.56832916);
                    iVar5 = SHIndex(9,1);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,3);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,7);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,9);
                    c_out[0x61] = c_in[iVar5] * -0.048317645 +
                                  fVar4 * 0.34765625 +
                                  fVar3 * -0.7162405 + fVar1 * 0.46242478 + fVar2 * 0.38725105;
                    iVar5 = SHIndex(9,-9);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,-7);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,-5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,-3);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,-1);
                    c_out[0x62] = c_in[iVar5] * -0.38519666 +
                                  fVar4 * 0.7526808 +
                                  fVar3 * -0.5093127 + fVar1 * -0.016572814 + fVar2 * 0.15944009;
                    iVar5 = SHIndex(9,1);
                    fVar1 = c_in[iVar5];
                    iVar5 = SHIndex(9,3);
                    fVar2 = c_in[iVar5];
                    iVar5 = SHIndex(9,5);
                    fVar3 = c_in[iVar5];
                    iVar5 = SHIndex(9,7);
                    fVar4 = c_in[iVar5];
                    iVar5 = SHIndex(9,9);
                    c_out[99] = c_in[iVar5] * 0.00390625 +
                                fVar4 * -0.048317645 +
                                fVar3 * 0.21608308 + fVar1 * 0.8171255 + -(fVar2 * 0.53222567);
                    if (9 < lmax) {
                      __assert_fail("lmax < 10",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                    ,0x1c3,
                                    "void SHRotateXPlus(const rot_data_t *, rot_data_t *, int)");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SHRotateXPlus(const rot_data_t *c_in, rot_data_t *c_out, int lmax) {
#define O(l, m)  c_in[SHIndex(l, m)]

    // first band is a no-op
    *c_out++ = c_in[0];

    if (lmax < 1) return;
    *c_out++ = (O(1,0));
    *c_out++ = (-1.*O(1,-1));
    *c_out++ = (O(1,1));

    if (lmax < 2) return;
    *c_out++ = (O(2,1));
    *c_out++ = (-1.*O(2,-1));
    *c_out++ = (-0.5*O(2,0) - 0.8660254037844386*O(2,2));
    *c_out++ = (-1.*O(2,-2));
    *c_out++ = (-0.8660254037844386*O(2,0) + 0.5*O(2,2));

    // Remainder of SH $x+$ rotation definition
    if (lmax < 3) return;
    *c_out++ = (-0.7905694150420949*O(3,0) + 0.6123724356957945*O(3,2));
    *c_out++ = (-1.*O(3,-2));
    *c_out++ = (-0.6123724356957945*O(3,0) - 0.7905694150420949*O(3,2));
    *c_out++ = (0.7905694150420949*O(3,-3) + 0.6123724356957945*O(3,-1));
    *c_out++ = (-0.25*O(3,1) - 0.9682458365518543*O(3,3));
    *c_out++ = (-0.6123724356957945*O(3,-3) + 0.7905694150420949*O(3,-1));
    *c_out++ = (-0.9682458365518543*O(3,1) + 0.25*O(3,3));
    
    if (lmax < 4) return;
    *c_out++ = (-0.9354143466934853*O(4,1) + 0.35355339059327373*O(4,3));
    *c_out++ = (-0.75*O(4,-3) + 0.6614378277661477*O(4,-1));
    *c_out++ = (-0.35355339059327373*O(4,1) - 0.9354143466934853*O(4,3));
    *c_out++ = (0.6614378277661477*O(4,-3) + 0.75*O(4,-1));
    *c_out++ = (0.375*O(4,0) + 0.5590169943749475*O(4,2) + 0.739509972887452*O(4,4));
    *c_out++ = (0.9354143466934853*O(4,-4) + 0.35355339059327373*O(4,-2));
    *c_out++ = (0.5590169943749475*O(4,0) + 0.5*O(4,2) - 0.6614378277661477*O(4,4));
    *c_out++ = (-0.35355339059327373*O(4,-4) + 0.9354143466934853*O(4,-2));
    *c_out++ = (0.739509972887452*O(4,0) - 0.6614378277661477*O(4,2) + 0.125*O(4,4));
    
    if (lmax < 5) return;
    *c_out++ = (0.701560760020114*O(5,0) - 0.6846531968814576*O(5,2) +
                0.19764235376052372*O(5,4));
    *c_out++ = (-0.5*O(5,-4) + 0.8660254037844386*O(5,-2));
    *c_out++ = (0.5229125165837972*O(5,0) + 0.30618621784789724*O(5,2) -
                0.795495128834866*O(5,4));
    *c_out++ = (0.8660254037844386*O(5,-4) + 0.5*O(5,-2));
    *c_out++ = (0.4841229182759271*O(5,0) + 0.6614378277661477*O(5,2) +
                0.57282196186948*O(5,4));
    *c_out++ = (-0.701560760020114*O(5,-5) - 0.5229125165837972*O(5,-3) -
                0.4841229182759271*O(5,-1));
    *c_out++ = (0.125*O(5,1) + 0.4050462936504913*O(5,3) + 0.9057110466368399*O(5,5));
    *c_out++ = (0.6846531968814576*O(5,-5) - 0.30618621784789724*O(5,-3) -
                0.6614378277661477*O(5,-1));
    *c_out++ = (0.4050462936504913*O(5,1) + 0.8125*O(5,3) - 0.4192627457812106*O(5,5));
    *c_out++ = (-0.19764235376052372*O(5,-5) + 0.795495128834866*O(5,-3) -
                0.57282196186948*O(5,-1));
    *c_out++ = (0.9057110466368399*O(5,1) - 0.4192627457812106*O(5,3) + 0.0625*O(5,5));
    
    if (lmax < 6) return;
    *c_out++ = (0.879452954966893*O(6,1) - 0.46351240544347894*O(6,3) +
                0.10825317547305482*O(6,5));
    *c_out++ = (-0.3125*O(6,-5) + 0.8028270361665706*O(6,-3) - 0.5077524002897476*O(6,-1));
    *c_out++ = (0.4330127018922193*O(6,1) + 0.6846531968814576*O(6,3) -
                0.5863019699779287*O(6,5));
    *c_out++ = (0.8028270361665706*O(6,-5) - 0.0625*O(6,-3) - 0.5929270612815711*O(6,-1));
    *c_out++ = (0.19764235376052372*O(6,1) + 0.5625*O(6,3) + 0.8028270361665706*O(6,5));
    *c_out++ = (-0.5077524002897476*O(6,-5) - 0.5929270612815711*O(6,-3) -
                0.625*O(6,-1));
    *c_out++ = (-0.3125*O(6,0) - 0.45285552331841994*O(6,2) - 0.49607837082461076*O(6,4) -
                0.6716932893813962*O(6,6));
    *c_out++ = (-0.879452954966893*O(6,-6) - 0.4330127018922193*O(6,-4) -
                0.19764235376052372*O(6,-2));
    *c_out++ = (-0.45285552331841994*O(6,0) - 0.53125*O(6,2) - 0.1711632992203644*O(6,4) +
                0.6952686081652184*O(6,6));
    *c_out++ = (0.46351240544347894*O(6,-6) - 0.6846531968814576*O(6,-4) -
                0.5625*O(6,-2));
    *c_out++ = (-0.49607837082461076*O(6,0) - 0.1711632992203644*O(6,2) +
                0.8125*O(6,4) - 0.2538762001448738*O(6,6));
    *c_out++ = (-0.10825317547305482*O(6,-6) + 0.5863019699779287*O(6,-4) -
                0.8028270361665706*O(6,-2));
    *c_out++ = (-0.6716932893813962*O(6,0) + 0.6952686081652184*O(6,2) -
                0.2538762001448738*O(6,4) + 0.03125*O(6,6));
    
    if (lmax < 7) return;
    *c_out++ = (-0.6472598492877494*O(7,0) + 0.6991205412874092*O(7,2) -
                0.2981060004427955*O(7,4) + 0.05846339666834283*O(7,6));
    *c_out++ = (-0.1875*O(7,-6) + 0.6373774391990981*O(7,-4) - 0.7473912964438374*O(7,-2));
    *c_out++ = (-0.47495887979908324*O(7,0) - 0.07328774624724109*O(7,2) +
                0.78125*O(7,4) - 0.3983608994994363*O(7,6));
    *c_out++ = (0.6373774391990981*O(7,-6) - 0.5*O(7,-4) - 0.5863019699779287*O(7,-2));
    *c_out++ = (-0.42961647140211*O(7,0) - 0.41984465132951254*O(7,2) +
                0.10364452469860624*O(7,4) + 0.7927281808728639*O(7,6));
    *c_out++ = (-0.7473912964438374*O(7,-6) - 0.5863019699779287*O(7,-4) -
                0.3125*O(7,-2));
    *c_out++ = (-0.41339864235384227*O(7,0) - 0.5740991584648073*O(7,2) -
                0.5385527481129402*O(7,4) - 0.4576818286211503*O(7,6));
    *c_out++ = (0.6472598492877494*O(7,-7) + 0.47495887979908324*O(7,-5) +
                0.42961647140211*O(7,-3) + 0.41339864235384227*O(7,-1));
    *c_out++ = (-0.078125*O(7,1) - 0.24356964481437335*O(7,3) - 0.4487939567607835*O(7,5) -
                0.8562442974262661*O(7,7));
    *c_out++ = (-0.6991205412874092*O(7,-7) + 0.07328774624724109*O(7,-5) +
                0.41984465132951254*O(7,-3) + 0.5740991584648073*O(7,-1));
    *c_out++ = (-0.24356964481437335*O(7,1) - 0.609375*O(7,3) - 0.5700448858423344*O(7,5) +
                0.4943528756111367*O(7,7));
    *c_out++ = (0.2981060004427955*O(7,-7) - 0.78125*O(7,-5) - 0.10364452469860624*O(7,-3) +
                0.5385527481129402*O(7,-1));
    *c_out++ = (-0.4487939567607835*O(7,1) - 0.5700448858423344*O(7,3) + 0.671875*O(7,5) -
                0.14905300022139775*O(7,7));
    *c_out++ = (-0.05846339666834283*O(7,-7) + 0.3983608994994363*O(7,-5) -
                0.7927281808728639*O(7,-3) + 0.4576818286211503*O(7,-1));
    *c_out++ = (-0.8562442974262661*O(7,1) + 0.4943528756111367*O(7,3) -
                0.14905300022139775*O(7,5) + 0.015625*O(7,7));
    
    if (lmax < 8) return;
    *c_out++ = (-0.8356088723200586*O(8,1) + 0.516334738808072*O(8,3) -
                0.184877493221863*O(8,5) + 0.03125*O(8,7));
    *c_out++ = (-0.109375*O(8,-7) + 0.4621937330546575*O(8,-5) - 0.774502108212108*O(8,-3) +
                0.4178044361600293*O(8,-1));
    *c_out++ = (-0.4576818286211503*O(8,1) - 0.47134697278119864*O(8,3) +
                0.7088310138883598*O(8,5) - 0.2567449488305466*O(8,7));
    *c_out++ = (0.4621937330546575*O(8,-7) - 0.703125*O(8,-5) - 0.2181912506838897*O(8,-3) +
                0.4943528756111367*O(8,-1));
    *c_out++ = (-0.27421763710600383*O(8,1) - 0.6051536478449089*O(8,3) -
                0.33802043207474897*O(8,5) + 0.6665852814906732*O(8,7));
    *c_out++ = (-0.774502108212108*O(8,-7) - 0.2181912506838897*O(8,-5) +
                0.265625*O(8,-3) + 0.5310201708739509*O(8,-1));
    *c_out++ = (-0.1307281291459493*O(8,1) - 0.38081430021731066*O(8,3) -
                0.5908647000371574*O(8,5) - 0.6991205412874092*O(8,7));
    *c_out++ = (0.4178044361600293*O(8,-7) + 0.4943528756111367*O(8,-5) +
                0.5310201708739509*O(8,-3) + 0.546875*O(8,-1));
    *c_out++ = (0.2734375*O(8,0) + 0.3921843874378479*O(8,2) + 0.4113264556590057*O(8,4) +
                0.4576818286211503*O(8,6) + 0.626706654240044*O(8,8));
    *c_out++ = (0.8356088723200586*O(8,-8) + 0.4576818286211503*O(8,-6) +
                0.27421763710600383*O(8,-4) + 0.1307281291459493*O(8,-2));
    *c_out++ = (0.3921843874378479*O(8,0) + 0.5*O(8,2) + 0.32775276505317236*O(8,4) -
                0.6991205412874092*O(8,8));
    *c_out++ = (-0.516334738808072*O(8,-8) + 0.47134697278119864*O(8,-6) +
                0.6051536478449089*O(8,-4) + 0.38081430021731066*O(8,-2));
    *c_out++ = (0.4113264556590057*O(8,0) + 0.32775276505317236*O(8,2) -
                0.28125*O(8,4) - 0.7302075903467452*O(8,6) + 0.3332926407453366*O(8,8));
    *c_out++ = (0.184877493221863*O(8,-8) - 0.7088310138883598*O(8,-6) +
                0.33802043207474897*O(8,-4) + 0.5908647000371574*O(8,-2));
    *c_out++ = (0.4576818286211503*O(8,0) - 0.7302075903467452*O(8,4) + 0.5*O(8,6) -
                0.0855816496101822*O(8,8));
    *c_out++ = (-0.03125*O(8,-8) + 0.2567449488305466*O(8,-6) - 0.6665852814906732*O(8,-4) +
                0.6991205412874092*O(8,-2));
    *c_out++ = (0.626706654240044*O(8,0) - 0.6991205412874092*O(8,2) +
                0.3332926407453366*O(8,4) - 0.0855816496101822*O(8,6) + 0.0078125*O(8,8));
    
    if (lmax < 9) return;
    *c_out++ = (0.6090493921755238*O(9,0) - 0.6968469725305549*O(9,2) +
                0.3615761395439417*O(9,4) - 0.11158481919598204*O(9,6) + 0.016572815184059706*O(9,8));
    *c_out++ = (-0.0625*O(9,-8) + 0.3156095293238149*O(9,-6) - 0.6817945071647321*O(9,-4) +
                0.656993626300895*O(9,-2));
    *c_out++ = (0.44314852502786806*O(9,0) - 0.05633673867912483*O(9,2) - 0.6723290616859425*O(9,4) +
                0.5683291712335379*O(9,6) - 0.1594400908746762*O(9,8));
    *c_out++ = (0.3156095293238149*O(9,-8) - 0.71875*O(9,-6) + 0.20252314682524564*O(9,-4) +
                0.5854685623498499*O(9,-2));
    *c_out++ = (0.39636409043643195*O(9,0) + 0.25194555463432966*O(9,2) - 0.3921843874378479*O(9,4) -
                0.6051536478449089*O(9,6) + 0.509312687906457*O(9,8));
    *c_out++ = (-0.6817945071647321*O(9,-8) + 0.20252314682524564*O(9,-6) + 0.5625*O(9,-4) +
                0.4215855488510013*O(9,-2));
    *c_out++ = (0.3754879637718099*O(9,0) + 0.42961647140211*O(9,2) + 0.13799626353637262*O(9,4) -
                0.2981060004427955*O(9,6) - 0.7526807559068452*O(9,8));
    *c_out++ = (0.656993626300895*O(9,-8) + 0.5854685623498499*O(9,-6) + 0.4215855488510013*O(9,-4) +
                0.21875*O(9,-2));
    *c_out++ = (0.36685490255855924*O(9,0) + 0.5130142237306876*O(9,2) + 0.4943528756111367*O(9,4) +
                0.4576818286211503*O(9,6) + 0.38519665736315783*O(9,8));
    *c_out++ = (-0.6090493921755238*O(9,-9) - 0.44314852502786806*O(9,-7) - 0.39636409043643195*O(9,-5) -
                0.3754879637718099*O(9,-3) - 0.36685490255855924*O(9,-1));
    *c_out++ = (0.0546875*O(9,1) + 0.16792332234534904*O(9,3) + 0.2954323500185787*O(9,5) +
                0.4624247721758373*O(9,7) + 0.8171255055356398*O(9,9));
    *c_out++ = (0.6968469725305549*O(9,-9) + 0.05633673867912483*O(9,-7) - 0.25194555463432966*O(9,-5) -
                0.42961647140211*O(9,-3) - 0.5130142237306876*O(9,-1));
    *c_out++ = (0.16792332234534904*O(9,1) + 0.453125*O(9,3) + 0.577279787559724*O(9,5) +
                0.387251054106054*O(9,7) - 0.5322256665703469*O(9,9));
    *c_out++ = (-0.3615761395439417*O(9,-9) + 0.6723290616859425*O(9,-7) + 0.3921843874378479*O(9,-5) -
                0.13799626353637262*O(9,-3) - 0.4943528756111367*O(9,-1));
    *c_out++ = (0.2954323500185787*O(9,1) + 0.577279787559724*O(9,3) + 0.140625*O(9,5) -
                0.7162405240429014*O(9,7) + 0.21608307321780204*O(9,9));
    *c_out++ = (0.11158481919598204*O(9,-9) - 0.5683291712335379*O(9,-7) + 0.6051536478449089*O(9,-5) +
                0.2981060004427955*O(9,-3) - 0.4576818286211503*O(9,-1));
    *c_out++ = (0.4624247721758373*O(9,1) + 0.387251054106054*O(9,3) - 0.7162405240429014*O(9,5) +
                0.34765625*O(9,7) - 0.048317644050206957*O(9,9));
    *c_out++ = (-0.016572815184059706*O(9,-9) + 0.1594400908746762*O(9,-7) - 0.509312687906457*O(9,-5) +
                0.7526807559068452*O(9,-3) - 0.38519665736315783*O(9,-1));
    *c_out++ = (0.8171255055356398*O(9,1) - 0.5322256665703469*O(9,3) + 0.21608307321780204*O(9,5) -
                0.048317644050206957*O(9,7) + 0.00390625*O(9,9));
    assert(lmax < 10);
    
#if 0
    if (lmax < 10) return;
    *c_out++ = (0.800447720175637*O(10,1) - 0.5437971423529642*O(10,3) + 0.24319347525427157*O(10,5) -
                0.06594508990677396*O(10,7) + 0.008734640537108554*O(10,9));
    *c_out++ = (-0.03515625*O(10,-9) + 0.20644078533943455*O(10,-7) - 0.5437971423529642*O(10,-5) +
                0.7295804257628147*O(10,-3) - 0.35797110294949086*O(10,-1));
    *c_out++ = (0.4645646483537033*O(10,1) + 0.3156095293238149*O(10,3) - 0.7057243619147634*O(10,5) +
                0.4210060495408587*O(10,7) - 0.09631896879639025*O(10,9));
    *c_out++ = (0.20644078533943455*O(10,-9) - 0.62890625*O(10,-7) + 0.5041938375082048*O(10,-5) +
                0.3543293897015177*O(10,-3) - 0.4267298778757763*O(10,-1));
    *c_out++ = (0.31049159295683837*O(10,1) + 0.5390625*O(10,3) - 0.017469281074217108*O(10,5) -
                0.6925528980529664*O(10,7) + 0.36479021288140734*O(10,9));
    *c_out++ = (-0.5437971423529642*O(10,-9) + 0.5041938375082048*O(10,-7) + 0.484375*O(10,-5) -
                0.034938562148434216*O(10,-3) - 0.46285353886245695*O(10,-1));
    *c_out++ = (0.19515618744994995*O(10,1) + 0.48613591206575135*O(10,3) + 0.4941058844013093*O(10,5) +
                0.09110862335695782*O(10,7) - 0.6878550219704731*O(10,9));
    *c_out++ = (0.7295804257628147*O(10,-9) + 0.3543293897015177*O(10,-7) - 0.034938562148434216*O(10,-5) -
                0.328125*O(10,-3) - 0.4829869223773042*O(10,-1));
    *c_out++ = (0.09472152853892297*O(10,1) + 0.2788526296496054*O(10,3) + 0.44538102542935076*O(10,5) +
                0.5748694230132831*O(10,7) + 0.6200241379499873*O(10,9));
    *c_out++ = (-0.35797110294949086*O(10,-9) - 0.4267298778757763*O(10,-7) - 0.46285353886245695*O(10,-5) -
                0.4829869223773042*O(10,-3) - 0.4921875*O(10,-1));
    *c_out++ = (-0.24609375*O(10,0) - 0.3512368283228746*O(10,2) - 0.3618292555284191*O(10,4) -
                0.3837778803237379*O(10,6) - 0.4306629552848579*O(10,8) - 0.5936279171365733*O(10,10));
    *c_out++ = (-0.800447720175637*O(10,-10) - 0.4645646483537033*O(10,-8) - 0.31049159295683837*O(10,-6) -
                0.19515618744994995*O(10,-4) - 0.09472152853892297*O(10,-2));
    *c_out++ = (-0.3512368283228746*O(10,0) - 0.46484375*O(10,2) - 0.36618880141431137*O(10,4) -
                0.18922142726223223*O(10,6) + 0.10058119679362292*O(10,8) + 0.6932080600734395*O(10,10));
    *c_out++ = (0.5437971423529642*O(10,-10) - 0.3156095293238149*O(10,-8) - 0.5390625*O(10,-6) -
                0.48613591206575135*O(10,-4) - 0.2788526296496054*O(10,-2));
    *c_out++ = (-0.3618292555284191*O(10,0) - 0.36618880141431137*O(10,2) + 0.015625*O(10,4) +
                0.4585145534256519*O(10,6) + 0.6137165055779013*O(10,8) - 0.38452264694764726*O(10,10));
    *c_out++ = (-0.24319347525427157*O(10,-10) + 0.7057243619147634*O(10,-8) + 0.017469281074217108*O(10,-6) -
                0.4941058844013093*O(10,-4) - 0.44538102542935076*O(10,-2));
    *c_out++ = (-0.3837778803237379*O(10,0) - 0.18922142726223223*O(10,2) + 0.4585145534256519*O(10,4) +
                0.462890625*O(10,6) - 0.6114934630648914*O(10,8) + 0.13594928558824104*O(10,10));
    *c_out++ = (0.06594508990677396*O(10,-10) - 0.4210060495408587*O(10,-8) + 0.6925528980529664*O(10,-6) -
                0.09110862335695782*O(10,-4) - 0.5748694230132831*O(10,-2));
    *c_out++ = (-0.4306629552848579*O(10,0) + 0.10058119679362292*O(10,2) + 0.6137165055779013*O(10,4) -
                0.6114934630648914*O(10,6) + 0.23046875*O(10,8) - 0.026921970218926214*O(10,10));
    *c_out++ = (-0.008734640537108554*O(10,-10) + 0.09631896879639025*O(10,-8) - 0.36479021288140734*O(10,-6) +
                0.6878550219704731*O(10,-4) - 0.6200241379499873*O(10,-2));
    *c_out++ = (-0.5936279171365733*O(10,0) + 0.6932080600734395*O(10,2) - 0.38452264694764726*O(10,4) +
                0.13594928558824104*O(10,6) - 0.026921970218926214*O(10,8) + 0.001953125*O(10,10));
#endif
#undef O
}